

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTexture.cpp
# Opt level: O0

bool __thiscall
sf::RenderTexture::create(RenderTexture *this,uint width,uint height,ContextSettings *settings)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  RenderTextureImplFBO *this_00;
  RenderTextureImplDefault *this_01;
  ContextSettings *settings_local;
  uint height_local;
  uint width_local;
  RenderTexture *this_local;
  
  bVar1 = Texture::create(&this->m_texture,width,height);
  if (bVar1) {
    setSmooth(this,false);
    if (this->m_impl != (RenderTextureImpl *)0x0) {
      (*this->m_impl->_vptr_RenderTextureImpl[1])();
    }
    bVar1 = priv::RenderTextureImplFBO::isAvailable();
    if (bVar1) {
      this_00 = (RenderTextureImplFBO *)operator_new(0x88);
      priv::RenderTextureImplFBO::RenderTextureImplFBO(this_00);
      this->m_impl = (RenderTextureImpl *)this_00;
      (this->m_texture).m_fboAttachment = true;
    }
    else {
      this_01 = (RenderTextureImplDefault *)operator_new(0x18);
      priv::RenderTextureImplDefault::RenderTextureImplDefault(this_01);
      this->m_impl = (RenderTextureImpl *)this_01;
    }
    uVar2 = (*this->m_impl->_vptr_RenderTextureImpl[2])
                      (this->m_impl,(ulong)width,(ulong)height,(ulong)(this->m_texture).m_texture,
                       settings);
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      RenderTarget::initialize(&this->super_RenderTarget);
      this_local._7_1_ = true;
    }
  }
  else {
    poVar3 = err();
    poVar3 = std::operator<<(poVar3,
                             "Impossible to create render texture (failed to create the target texture)"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RenderTexture::create(unsigned int width, unsigned int height, const ContextSettings& settings)
{
    // Create the texture
    if (!m_texture.create(width, height))
    {
        err() << "Impossible to create render texture (failed to create the target texture)" << std::endl;
        return false;
    }

    // We disable smoothing by default for render textures
    setSmooth(false);

    // Create the implementation
    delete m_impl;
    if (priv::RenderTextureImplFBO::isAvailable())
    {
        // Use frame-buffer object (FBO)
        m_impl = new priv::RenderTextureImplFBO;

        // Mark the texture as being a framebuffer object attachment
        m_texture.m_fboAttachment = true;
    }
    else
    {
        // Use default implementation
        m_impl = new priv::RenderTextureImplDefault;
    }

    // Initialize the render texture
    if (!m_impl->create(width, height, m_texture.m_texture, settings))
        return false;

    // We can now initialize the render target part
    RenderTarget::initialize();

    return true;
}